

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__zlib_bitrev(int code,int codebits)

{
  int res;
  bool bVar1;
  
  res = 0;
  while (bVar1 = codebits != 0, codebits = codebits + -1, bVar1) {
    res = (code & 1U) + res * 2;
    code = code >> 1;
  }
  return res;
}

Assistant:

static int stbiw__zlib_bitrev(int code, int codebits)
{
   int res=0;
   while (codebits--) {
      res = (res << 1) | (code & 1);
      code >>= 1;
   }
   return res;
}